

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssse3_gemm.h
# Opt level: O0

void intgemm::SSSE3::Kernels8::PrepareBTransposed
               (float *input,int8_t *output,float quant_mult,Index cols,Index rows)

{
  FRegister mult_reg;
  uint in_ECX;
  uint in_EDX;
  undefined4 *in_RSI;
  undefined8 in_RDI;
  float in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Index ri;
  Index c;
  Index r;
  Register *output_it;
  FRegister q;
  Index kColStride;
  Index RegisterElemsInt;
  uint local_4c;
  uint local_48;
  uint local_44;
  undefined4 *local_40;
  Index row_step;
  Index cols_00;
  undefined4 *puVar1;
  
  cols_00 = 0x10;
  row_step = 8;
  local_40 = in_RSI;
  set1_ps<float__vector(4)>(in_XMM0_Da);
  local_44 = 0;
  local_48 = 0;
  puVar1 = local_40;
  while (local_44 < in_ECX) {
    for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
      mult_reg[2] = (float)(int)in_RDI;
      mult_reg[3] = (float)(int)((ulong)in_RDI >> 0x20);
      mult_reg._0_8_ = puVar1;
      QuantizeTile8::ConsecutiveWithWrapping
                (mult_reg,(float *)CONCAT44(in_XMM0_Da,in_EDX),in_ECX,cols_00,row_step);
      *local_40 = extraout_XMM0_Da;
      local_40[1] = extraout_XMM0_Db;
      local_40[2] = extraout_XMM0_Dc;
      local_40[3] = extraout_XMM0_Dd;
      local_40 = local_40 + 4;
    }
    for (local_48 = local_48 + 0x10; in_EDX <= local_48; local_48 = local_48 - in_EDX) {
      local_44 = local_44 + 8;
    }
  }
  return;
}

Assistant:

INTGEMM_SSSE3 static void SelectColumnsB(const int8_t *input, int8_t *output, Index rows, const Index *cols_begin, const Index *cols_end) {
    SSSE3::SelectColumnsOfB((const __m128i*)input, (__m128i*)output, rows, cols_begin, cols_end);
  }